

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

int mp_mul(mp_int *a,mp_int *b,mp_int *c)

{
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  int digs;
  int neg;
  int res;
  int in_stack_00000044;
  mp_int *in_stack_00000048;
  mp_int *in_stack_00000050;
  mp_int *in_stack_00000058;
  int in_stack_00001024;
  mp_int *in_stack_00001028;
  mp_int *in_stack_00001030;
  mp_int *in_stack_00001038;
  uint local_2c;
  int local_28;
  int local_1c;
  
  local_2c = (uint)(in_RDI[2] != in_RSI[2]);
  if (*in_RDI + *in_RSI + 1 < 0x200) {
    if (*in_RDI < *in_RSI) {
      local_28 = *in_RDI;
    }
    else {
      local_28 = *in_RSI;
    }
    if (local_28 < 0x101) {
      local_1c = fast_s_mp_mul_digs(in_stack_00001038,in_stack_00001030,in_stack_00001028,
                                    in_stack_00001024);
      goto LAB_00106fec;
    }
  }
  local_1c = s_mp_mul_digs(in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000044);
LAB_00106fec:
  if (*in_RDX < 1) {
    local_2c = 0;
  }
  in_RDX[2] = local_2c;
  return local_1c;
}

Assistant:

int mp_mul (mp_int * a, mp_int * b, mp_int * c)
{
  int     res, neg;
  neg = (a->sign == b->sign) ? MP_ZPOS : MP_NEG;

  {
    /* can we use the fast multiplier?
     *
     * The fast multiplier can be used if the output will 
     * have less than MP_WARRAY digits and the number of 
     * digits won't affect carry propagation
     */
    int     digs = a->used + b->used + 1;

    if ((digs < MP_WARRAY) &&
        MIN(a->used, b->used) <= 
        (1 << ((CHAR_BIT * sizeof (mp_word)) - (2 * DIGIT_BIT)))) {
      res = fast_s_mp_mul_digs (a, b, c, digs);
    } else 
      res = s_mp_mul (a, b, c); /* uses s_mp_mul_digs */
  }
  c->sign = (c->used > 0) ? neg : MP_ZPOS;
  return res;
}